

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::FunctionCreationContext::~FunctionCreationContext
          (FunctionCreationContext *this)

{
  _Rb_tree_color index;
  TranslateToFuzzReader *this_00;
  bool bVar1;
  Type type;
  Expression *value;
  LocalSet *left;
  Block *pBVar2;
  Builder *this_01;
  optional<wasm::Type> type_00;
  LocalStructuralDominance local_60 [8];
  LocalStructuralDominance info;
  _Rb_tree_node_base *local_48;
  
  ::wasm::LocalStructuralDominance::LocalStructuralDominance
            (local_60,this->func,this->parent->wasm,NonNullableOnly);
  for (; local_48 != (_Rb_tree_node_base *)&info;
      local_48 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_48)) {
    index = local_48[1]._M_color;
    bVar1 = Random::oneIn(&this->parent->random,5);
    if (!bVar1) {
      this_00 = this->parent;
      type.id = ::wasm::Function::getLocalType((uint)this->func);
      value = makeTrivial(this_00,type);
      this_01 = &this->parent->builder;
      left = Builder::makeLocalSet(this_01,index,value);
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)this->func;
      pBVar2 = Builder::makeSequence(this_01,(Expression *)left,this->func->body,type_00);
      this->func->body = (Expression *)pBVar2;
    }
  }
  ::wasm::TypeUpdating::handleNonDefaultableLocals(this->func,this->parent->wasm);
  if ((this->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((this->hangStack).
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->hangStack).
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this->parent->funcContext = (FunctionCreationContext *)0x0;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_60);
      std::
      _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&(this->typeLocals)._M_h);
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                (&(this->hangStack).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>);
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                (&(this->breakableStack).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>);
      return;
    }
    __assert_fail("hangStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4b3,
                  "wasm::TranslateToFuzzReader::FunctionCreationContext::~FunctionCreationContext()"
                 );
  }
  __assert_fail("breakableStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x4b2,
                "wasm::TranslateToFuzzReader::FunctionCreationContext::~FunctionCreationContext()");
}

Assistant:

TranslateToFuzzReader::FunctionCreationContext::~FunctionCreationContext() {
  // We must ensure non-nullable locals validate. Later down we'll run
  // TypeUpdating::handleNonDefaultableLocals which will make them validate by
  // turning them nullable + add ref.as_non_null to fix up types. That has the
  // downside of making them trap at runtime, however, and also we lose the non-
  // nullability in the type, so we prefer to do a manual fixup that avoids a
  // trap, which we do by writing a non-nullable value into the local at the
  // function entry.
  // TODO: We could be more precise and use a LocalGraph here, at the cost of
  //       doing more work.
  LocalStructuralDominance info(
    func, parent.wasm, LocalStructuralDominance::NonNullableOnly);
  for (auto index : info.nonDominatingIndices) {
    // Do not always do this, but with high probability, to reduce the amount of
    // traps.
    if (!parent.oneIn(5)) {
      auto* value = parent.makeTrivial(func->getLocalType(index));
      func->body = parent.builder.makeSequence(
        parent.builder.makeLocalSet(index, value), func->body);
    }
  }

  // Then, to handle remaining cases we did not just fix up, do the general
  // fixup to ensure we validate.
  TypeUpdating::handleNonDefaultableLocals(func, parent.wasm);

  assert(breakableStack.empty());
  assert(hangStack.empty());
  parent.funcContext = nullptr;
}